

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::WriteChaptersCue(FILE *f,Chapters *chapters,Atom *atom,Display *display)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = fputc(10,(FILE *)f);
  if (-1 < iVar2) {
    bVar1 = WriteChaptersCueIdentifier(f,atom);
    if (bVar1) {
      bVar1 = WriteChaptersCueTimings(f,chapters,atom);
      if (bVar1) {
        bVar1 = WriteChaptersCuePayload(f,display);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool vttdemux::WriteChaptersCue(FILE* f, const mkvparser::Chapters* chapters,
                                const mkvparser::Chapters::Atom* atom,
                                const mkvparser::Chapters::Display* display) {
  // We start a new cue by writing a cue separator (an empty line)
  // into the stream.

  if (fputc('\n', f) < 0)
    return false;

  // A WebVTT Cue comprises 3 things: a cue identifier, followed by
  // the cue timings, followed by the payload of the cue.  We write
  // each part of the cue in sequence.

  if (!WriteChaptersCueIdentifier(f, atom))
    return false;

  if (!WriteChaptersCueTimings(f, chapters, atom))
    return false;

  if (!WriteChaptersCuePayload(f, display))
    return false;

  return true;
}